

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::setRootIndex(QColumnView *this,QModelIndex *index)

{
  QColumnViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  QModelIndex *this_01;
  QItemSelectionModel *pQVar2;
  long in_FS_OFFSET;
  QAbstractItemView *view;
  QColumnViewPrivate *d;
  bool in_stack_000000f7;
  QModelIndex *in_stack_000000f8;
  QColumnViewPrivate *in_stack_00000100;
  QAbstractItemView *in_stack_ffffffffffffffc0;
  QModelIndex *index_00;
  QColumnViewPrivate *this_02;
  undefined1 in_stack_ffffffffffffffe7;
  QModelIndex *in_stack_ffffffffffffffe8;
  QColumnViewPrivate *in_stack_fffffffffffffff0;
  QColumnViewPrivate *this_03;
  
  this_03 = *(QColumnViewPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QColumnView *)0x86261f);
  pQVar1 = QAbstractItemView::model(in_stack_ffffffffffffffc0);
  if (pQVar1 != (QAbstractItemModel *)0x0) {
    this_02 = this_00;
    QModelIndex::QModelIndex((QModelIndex *)0x86264d);
    QColumnViewPrivate::closeColumns
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
    this_01 = (QModelIndex *)
              QColumnViewPrivate::createColumn
                        (in_stack_00000100,in_stack_000000f8,in_stack_000000f7);
    pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
    if (pQVar2 != (QItemSelectionModel *)0x0) {
      QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
      QObject::deleteLater();
    }
    pQVar1 = QAbstractItemView::model((QAbstractItemView *)this_01);
    index_00 = this_01;
    if (pQVar1 != (QAbstractItemModel *)0x0) {
      pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
      (**(code **)(*(long *)this_01 + 0x1d0))(this_01,pQVar2);
    }
    QAbstractItemView::setRootIndex((QAbstractItemView *)this_02,index_00);
    QColumnViewPrivate::updateScrollbars(this_03);
  }
  if (*(QColumnViewPrivate **)(in_FS_OFFSET + 0x28) != this_03) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::setRootIndex(const QModelIndex &index)
{
    Q_D(QColumnView);
    if (!model())
        return;

    d->closeColumns();
    Q_ASSERT(d->columns.size() == 0);

    QAbstractItemView *view = d->createColumn(index, true);
    if (view->selectionModel())
        view->selectionModel()->deleteLater();
    if (view->model())
        view->setSelectionModel(selectionModel());

    QAbstractItemView::setRootIndex(index);
    d->updateScrollbars();
}